

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_decoder.c
# Opt level: O0

void lzma_decoder_reset(void *coder_ptr,void *opt)

{
  undefined4 uVar1;
  uint local_60;
  uint local_5c;
  uint32_t bt_i_7;
  uint32_t bt_i_6;
  uint32_t bt_i_5;
  uint32_t bt_i_4;
  uint32_t bt_i_3;
  uint32_t bt_i_2;
  uint32_t pos_state;
  uint32_t num_pos_states;
  uint32_t bt_i_1;
  uint32_t i_2;
  uint32_t bt_i;
  uint32_t i_1;
  uint32_t j;
  uint32_t i;
  lzma_options_lzma *options;
  lzma_lzma1_decoder *coder;
  void *opt_local;
  void *coder_ptr_local;
  
  *(int *)((long)coder_ptr + 0x6e8c) = (1 << ((byte)*(undefined4 *)((long)opt + 0x1c) & 0x1f)) + -1;
  literal_init((probability (*) [768])coder_ptr,*(uint32_t *)((long)opt + 0x14),
               *(uint32_t *)((long)opt + 0x18));
  *(undefined4 *)((long)coder_ptr + 0x6e90) = *(undefined4 *)((long)opt + 0x14);
  *(int *)((long)coder_ptr + 0x6e94) = (1 << ((byte)*(undefined4 *)((long)opt + 0x18) & 0x1f)) + -1;
  *(undefined4 *)((long)coder_ptr + 0x6e78) = 0;
  *(undefined4 *)((long)coder_ptr + 0x6e7c) = 0;
  *(undefined4 *)((long)coder_ptr + 0x6e80) = 0;
  *(undefined4 *)((long)coder_ptr + 0x6e84) = 0;
  *(undefined4 *)((long)coder_ptr + 0x6e88) = 0;
  *(int *)((long)coder_ptr + 0x6e8c) = (1 << ((byte)*(undefined4 *)((long)opt + 0x1c) & 0x1f)) + -1;
  *(undefined4 *)((long)coder_ptr + 0x6e6c) = 0xffffffff;
  *(undefined4 *)((long)coder_ptr + 0x6e70) = 0;
  *(undefined4 *)((long)coder_ptr + 0x6e74) = 5;
  for (i_1 = 0; i_1 < 0xc; i_1 = i_1 + 1) {
    for (bt_i = 0; bt_i <= *(uint *)((long)coder_ptr + 0x6e8c); bt_i = bt_i + 1) {
      *(undefined2 *)((long)coder_ptr + (ulong)bt_i * 2 + (ulong)i_1 * 0x20 + 0x6000) = 0x400;
      *(undefined2 *)((long)coder_ptr + (ulong)bt_i * 2 + (ulong)i_1 * 0x20 + 0x61e0) = 0x400;
    }
    *(undefined2 *)((long)coder_ptr + (ulong)i_1 * 2 + 0x6180) = 0x400;
    *(undefined2 *)((long)coder_ptr + (ulong)i_1 * 2 + 0x6198) = 0x400;
    *(undefined2 *)((long)coder_ptr + (ulong)i_1 * 2 + 0x61b0) = 0x400;
    *(undefined2 *)((long)coder_ptr + (ulong)i_1 * 2 + 0x61c8) = 0x400;
  }
  for (i_2 = 0; i_2 < 4; i_2 = i_2 + 1) {
    for (bt_i_1 = 0; bt_i_1 < 0x40; bt_i_1 = bt_i_1 + 1) {
      *(undefined2 *)((long)coder_ptr + (ulong)bt_i_1 * 2 + (ulong)i_2 * 0x80 + 0x6360) = 0x400;
    }
  }
  for (num_pos_states = 0; num_pos_states < 0x72; num_pos_states = num_pos_states + 1) {
    *(undefined2 *)((long)coder_ptr + (ulong)num_pos_states * 2 + 0x6560) = 0x400;
  }
  for (pos_state = 0; pos_state < 0x10; pos_state = pos_state + 1) {
    *(undefined2 *)((long)coder_ptr + (ulong)pos_state * 2 + 0x6644) = 0x400;
  }
  uVar1 = *(undefined4 *)((long)opt + 0x1c);
  *(undefined2 *)((long)coder_ptr + 0x6664) = 0x400;
  *(undefined2 *)((long)coder_ptr + 0x6666) = 0x400;
  *(undefined2 *)((long)coder_ptr + 0x6a68) = 0x400;
  *(undefined2 *)((long)coder_ptr + 0x6a6a) = 0x400;
  for (bt_i_3 = 0; bt_i_3 < (uint)(1 << ((byte)uVar1 & 0x1f)); bt_i_3 = bt_i_3 + 1) {
    for (bt_i_4 = 0; bt_i_4 < 8; bt_i_4 = bt_i_4 + 1) {
      *(undefined2 *)((long)coder_ptr + (ulong)bt_i_4 * 2 + (ulong)bt_i_3 * 0x10 + 0x6668) = 0x400;
    }
    for (bt_i_5 = 0; bt_i_5 < 8; bt_i_5 = bt_i_5 + 1) {
      *(undefined2 *)((long)coder_ptr + (ulong)bt_i_5 * 2 + (ulong)bt_i_3 * 0x10 + 0x6768) = 0x400;
    }
    for (bt_i_6 = 0; bt_i_6 < 8; bt_i_6 = bt_i_6 + 1) {
      *(undefined2 *)((long)coder_ptr + (ulong)bt_i_6 * 2 + (ulong)bt_i_3 * 0x10 + 0x6a6c) = 0x400;
    }
    for (bt_i_7 = 0; bt_i_7 < 8; bt_i_7 = bt_i_7 + 1) {
      *(undefined2 *)((long)coder_ptr + (ulong)bt_i_7 * 2 + (ulong)bt_i_3 * 0x10 + 0x6b6c) = 0x400;
    }
  }
  for (local_5c = 0; local_5c < 0x100; local_5c = local_5c + 1) {
    *(undefined2 *)((long)coder_ptr + (ulong)local_5c * 2 + 0x6868) = 0x400;
  }
  for (local_60 = 0; local_60 < 0x100; local_60 = local_60 + 1) {
    *(undefined2 *)((long)coder_ptr + (ulong)local_60 * 2 + 0x6c6c) = 0x400;
  }
  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 1;
  *(undefined8 *)((long)coder_ptr + 0x6ea8) = 0;
  *(undefined4 *)((long)coder_ptr + 0x6eb0) = 0;
  *(undefined4 *)((long)coder_ptr + 0x6eb4) = 0;
  *(undefined4 *)((long)coder_ptr + 0x6eb8) = 0;
  *(undefined4 *)((long)coder_ptr + 0x6ebc) = 0;
  return;
}

Assistant:

static void
lzma_decoder_reset(void *coder_ptr, const void *opt)
{
	lzma_lzma1_decoder *coder = coder_ptr;
	const lzma_options_lzma *options = opt;

	// NOTE: We assume that lc/lp/pb are valid since they were
	// successfully decoded with lzma_lzma_decode_properties().

	// Calculate pos_mask. We don't need pos_bits as is for anything.
	coder->pos_mask = (1U << options->pb) - 1;

	// Initialize the literal decoder.
	literal_init(coder->literal, options->lc, options->lp);

	coder->literal_context_bits = options->lc;
	coder->literal_pos_mask = (1U << options->lp) - 1;

	// State
	coder->state = STATE_LIT_LIT;
	coder->rep0 = 0;
	coder->rep1 = 0;
	coder->rep2 = 0;
	coder->rep3 = 0;
	coder->pos_mask = (1U << options->pb) - 1;

	// Range decoder
	rc_reset(coder->rc);

	// Bit and bittree decoders
	for (uint32_t i = 0; i < STATES; ++i) {
		for (uint32_t j = 0; j <= coder->pos_mask; ++j) {
			bit_reset(coder->is_match[i][j]);
			bit_reset(coder->is_rep0_long[i][j]);
		}

		bit_reset(coder->is_rep[i]);
		bit_reset(coder->is_rep0[i]);
		bit_reset(coder->is_rep1[i]);
		bit_reset(coder->is_rep2[i]);
	}

	for (uint32_t i = 0; i < DIST_STATES; ++i)
		bittree_reset(coder->dist_slot[i], DIST_SLOT_BITS);

	for (uint32_t i = 0; i < FULL_DISTANCES - DIST_MODEL_END; ++i)
		bit_reset(coder->pos_special[i]);

	bittree_reset(coder->pos_align, ALIGN_BITS);

	// Len decoders (also bit/bittree)
	const uint32_t num_pos_states = 1U << options->pb;
	bit_reset(coder->match_len_decoder.choice);
	bit_reset(coder->match_len_decoder.choice2);
	bit_reset(coder->rep_len_decoder.choice);
	bit_reset(coder->rep_len_decoder.choice2);

	for (uint32_t pos_state = 0; pos_state < num_pos_states; ++pos_state) {
		bittree_reset(coder->match_len_decoder.low[pos_state],
				LEN_LOW_BITS);
		bittree_reset(coder->match_len_decoder.mid[pos_state],
				LEN_MID_BITS);

		bittree_reset(coder->rep_len_decoder.low[pos_state],
				LEN_LOW_BITS);
		bittree_reset(coder->rep_len_decoder.mid[pos_state],
				LEN_MID_BITS);
	}

	bittree_reset(coder->match_len_decoder.high, LEN_HIGH_BITS);
	bittree_reset(coder->rep_len_decoder.high, LEN_HIGH_BITS);

	coder->sequence = SEQ_IS_MATCH;
	coder->probs = NULL;
	coder->symbol = 0;
	coder->limit = 0;
	coder->offset = 0;
	coder->len = 0;

	return;
}